

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout,Encoding encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  cmsysProcess *cp;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  OutputOption OVar7;
  pointer pbVar8;
  bool bVar9;
  cmProcessOutput processOutput;
  int length;
  char *data;
  string strdata;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  cmProcessOutput local_159;
  OutputOption local_158;
  int local_154;
  char *local_150;
  string local_148;
  char **local_128;
  iterator iStack_120;
  char **local_118;
  void *local_108;
  undefined8 uStack_100;
  long local_f8;
  void *local_e8;
  undefined8 uStack_e0;
  long local_d8;
  int *local_c8;
  double local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_128 = (char **)0x0;
  iStack_120._M_current = (char **)0x0;
  local_118 = (char **)0x0;
  pbVar8 = (command->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_158 = outputflag;
  local_c8 = retVal;
  local_c0 = timeout;
  local_b8 = dir;
  if (pbVar8 != (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_148._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      if (iStack_120._M_current == local_118) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_128,iStack_120,
                   (char **)&local_148);
      }
      else {
        *iStack_120._M_current = local_148._M_dataplus._M_p;
        iStack_120._M_current = iStack_120._M_current + 1;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != (command->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_148._M_dataplus._M_p = (pointer)0x0;
  if (iStack_120._M_current == local_118) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_128,iStack_120,
               (char **)&local_148);
  }
  else {
    *iStack_120._M_current = (char *)0x0;
    iStack_120._M_current = iStack_120._M_current + 1;
  }
  cp = cmsysProcess_New();
  OVar7 = local_158;
  cmsysProcess_SetCommand(cp,local_128);
  cmsysProcess_SetWorkingDirectory(cp,local_b8);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (OVar7 == OUTPUT_MERGE) {
LAB_003107cb:
    cmsysProcess_SetOption(cp,2,1);
LAB_003107dd:
    captureStdErr = (string *)0x0;
  }
  else if (OVar7 == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp,2,1);
    cmsysProcess_SetPipeShared(cp,3,1);
    captureStdErr = (string *)0x0;
    captureStdOut = (string *)0x0;
  }
  else {
    if (captureStdErr == (string *)0x0) goto LAB_003107dd;
    if (captureStdErr == captureStdOut) goto LAB_003107cb;
  }
  if (captureStdErr == captureStdOut && captureStdErr != (string *)0x0) {
    __assert_fail("!captureStdErr || captureStdErr != captureStdOut",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmSystemTools.cxx"
                  ,0x2a4,
                  "static bool cmSystemTools::RunSingleCommand(const std::vector<std::string> &, std::string *, std::string *, int *, const char *, OutputOption, double, Encoding)"
                 );
  }
  cmsysProcess_SetTimeout(cp,local_c0);
  cmsysProcess_Execute(cp);
  local_e8 = (void *)0x0;
  uStack_e0 = 0;
  local_d8 = 0;
  local_f8 = 0;
  local_108 = (void *)0x0;
  uStack_100 = 0;
  cmProcessOutput::cmProcessOutput(&local_159,encoding,0x400);
  paVar1 = &local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)paVar1;
  if ((OVar7 != OUTPUT_PASSTHROUGH) &&
     (((OVar7 != OUTPUT_NONE || (captureStdErr != (string *)0x0)) ||
      (captureStdOut != (string *)0x0)))) {
    while( true ) {
      iVar3 = cmsysProcess_WaitForData(cp,&local_150,&local_154,(double *)0x0);
      OVar7 = local_158;
      if (iVar3 < 1) break;
      if (0 < local_154) {
        lVar6 = 0;
        do {
          if (local_150[lVar6] == '\0') {
            local_150[lVar6] = ' ';
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < local_154);
      }
      if (iVar3 == 2) {
        if (local_158 != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&local_159,local_150,(long)local_154,&local_148,1);
          Stdout(local_148._M_dataplus._M_p,local_148._M_string_length);
        }
        if (captureStdOut != (string *)0x0) {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_e8,uStack_e0);
        }
      }
      else if (iVar3 == 3) {
        if (local_158 != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&local_159,local_150,(long)local_154,&local_148,2);
          Stderr(local_148._M_dataplus._M_p,local_148._M_string_length);
        }
        if (captureStdErr != (string *)0x0) {
          std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                    ((vector<char,std::allocator<char>> *)&local_108,uStack_100);
        }
      }
    }
    if (local_158 != OUTPUT_NONE) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      cmProcessOutput::DecodeText(&local_159,&local_50,&local_148,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (local_148._M_string_length != 0) {
        Stdout(local_148._M_dataplus._M_p,local_148._M_string_length);
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmProcessOutput::DecodeText(&local_159,&local_70,&local_148,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (local_148._M_string_length != 0) {
        Stderr(local_148._M_dataplus._M_p,local_148._M_string_length);
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (captureStdOut != (string *)0x0) {
    pcVar2 = (captureStdOut->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdOut,pcVar2,pcVar2 + captureStdOut->_M_string_length,local_e8,
               uStack_e0);
    pcVar2 = (captureStdOut->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + captureStdOut->_M_string_length);
    cmProcessOutput::DecodeText(&local_159,&local_90,captureStdOut,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (captureStdErr != (string *)0x0) {
    pcVar2 = (captureStdErr->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdErr,pcVar2,pcVar2 + captureStdErr->_M_string_length,local_108,
               uStack_100);
    pcVar2 = (captureStdErr->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + captureStdErr->_M_string_length);
    cmProcessOutput::DecodeText(&local_159,&local_b0,captureStdErr,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = cmsysProcess_GetState(cp);
  if (iVar3 == 4) {
    if (local_c8 == (int *)0x0) {
      iVar3 = cmsysProcess_GetExitValue(cp);
      bVar9 = iVar3 == 0;
    }
    else {
      iVar3 = cmsysProcess_GetExitValue(cp);
      *local_c8 = iVar3;
      bVar9 = true;
    }
  }
  else {
    iVar3 = cmsysProcess_GetState(cp);
    if (iVar3 == 2) {
      pcVar4 = cmsysProcess_GetExceptionString(cp);
      if (OVar7 != OUTPUT_NONE) {
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x70a260);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
      }
      if (captureStdErr != (string *)0x0) {
        strlen(pcVar4);
        std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar4);
      }
    }
    else {
      iVar3 = cmsysProcess_GetState(cp);
      if (iVar3 == 1) {
        pcVar4 = cmsysProcess_GetErrorString(cp);
        if (OVar7 != OUTPUT_NONE) {
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x70a260);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
          std::ostream::put('`');
          std::ostream::flush();
        }
        if (captureStdErr != (string *)0x0) {
          strlen(pcVar4);
          std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar4);
        }
      }
      else {
        iVar3 = cmsysProcess_GetState(cp);
        bVar9 = true;
        if (iVar3 != 5) goto LAB_00310d99;
        if (OVar7 != OUTPUT_NONE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Process terminated due to timeout\n",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
          std::ostream::put('`');
          std::ostream::flush();
        }
        if (captureStdErr != (string *)0x0) {
          std::__cxx11::string::append((char *)captureStdErr,0x5c367f);
        }
      }
    }
    bVar9 = false;
  }
LAB_00310d99:
  cmsysProcess_Delete(cp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_159);
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  if (local_128 != (char **)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  return bVar9;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     double timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  for (std::vector<std::string>::const_iterator a = command.begin();
       a != command.end(); ++a) {
    argv.push_back(a->c_str());
  }
  argv.push_back(CM_NULLPTR);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = CM_NULLPTR;
    captureStdErr = CM_NULLPTR;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = CM_NULLPTR;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata.c_str(), strdata.size());
        }
        if (captureStdOut) {
          tempStdOut.insert(tempStdOut.end(), data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata.c_str(), strdata.size());
        }
        if (captureStdErr) {
          tempStdErr.insert(tempStdErr.end(), data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata.c_str(), strdata.size());
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata.c_str(), strdata.size());
      }
    }
  }

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}